

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O2

void __thiscall
Units_scalingFactorBetweenUnitsDifferentScale_Test::
~Units_scalingFactorBetweenUnitsDifferentScale_Test
          (Units_scalingFactorBetweenUnitsDifferentScale_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Units, scalingFactorBetweenUnitsDifferentScale)
{
    auto u1 = libcellml::Units::create("units");
    u1->addUnit("second", "kilo");

    auto u2 = libcellml::Units::create("units");
    u2->addUnit("second", 5, 1);

    auto scaling = libcellml::Units::scalingFactor(u1, u2);
    EXPECT_EQ(100.0, scaling);
}